

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O3

int Wlc_NtkCreateLevelsRev(Wlc_Ntk_t *p)

{
  long lVar1;
  Wlc_Obj_t *pWVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  int iVar6;
  int *piVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar12;
  
  uVar9 = p->iObj;
  if ((p->vLevels).nCap < (int)uVar9) {
    piVar7 = (p->vLevels).pArray;
    if (piVar7 == (int *)0x0) {
      piVar7 = (int *)malloc((long)(int)uVar9 << 2);
    }
    else {
      piVar7 = (int *)realloc(piVar7,(long)(int)uVar9 << 2);
    }
    (p->vLevels).pArray = piVar7;
    if (piVar7 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vLevels).nCap = uVar9;
  }
  if (0 < (int)uVar9) {
    memset((p->vLevels).pArray,0,(ulong)uVar9 * 4);
  }
  (p->vLevels).nSize = uVar9;
  iVar6 = 0;
  if (1 < (long)p->iObj) {
    iVar6 = 0;
    lVar8 = (long)p->iObj;
    do {
      if (p->nObjsAlloc < lVar8) goto LAB_0036b0e8;
      lVar1 = lVar8 + -1;
      if ((undefined1  [24])((undefined1  [24])p->pObjs[lVar1] & (undefined1  [24])0x3d) !=
          (undefined1  [24])0x1) {
        if ((p->vLevels).nSize < lVar8) goto LAB_0036b0c9;
        pWVar2 = p->pObjs + lVar1;
        piVar7 = (p->vLevels).pArray;
        iVar3 = piVar7[lVar1];
        iVar4 = iVar3 + 1;
        uVar9 = pWVar2->nFanins;
        if (0 < (int)uVar9) {
          lVar10 = 0;
          do {
            if ((2 < uVar9) ||
               (paVar12 = &pWVar2->field_10, (*(uint *)pWVar2 & 0x3f | 0x10) == 0x16)) {
              paVar12 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pWVar2->field_10).pFanins[0];
            }
            lVar11 = (long)paVar12->Fanins[lVar10];
            if ((lVar11 < 0) || ((p->vLevels).nSize <= paVar12->Fanins[lVar10])) goto LAB_0036b0c9;
            if (piVar7[lVar11] <= iVar3) {
              piVar7[lVar11] = iVar4;
              uVar9 = pWVar2->nFanins;
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 < (int)uVar9);
        }
        if (iVar6 <= iVar4) {
          iVar6 = iVar4;
        }
      }
      bVar5 = 2 < lVar8;
      lVar8 = lVar1;
    } while (bVar5);
    if (1 < p->iObj) {
      lVar8 = 1;
      do {
        if (p->nObjsAlloc <= lVar8) goto LAB_0036b0e8;
        if ((p->vLevels).nSize <= lVar8) {
LAB_0036b0c9:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        piVar7 = (p->vLevels).pArray;
        piVar7[lVar8] = iVar6 - piVar7[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 < p->iObj);
    }
  }
  if (0 < (p->vCis).nSize) {
    piVar7 = (p->vCis).pArray;
    lVar8 = 0;
    do {
      iVar4 = piVar7[lVar8];
      if (((long)iVar4 < 1) || (p->nObjsAlloc <= iVar4)) {
LAB_0036b0e8:
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      if ((p->vLevels).nSize <= iVar4) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (p->vLevels).pArray[iVar4] = 0;
      lVar8 = lVar8 + 1;
    } while (lVar8 < (p->vCis).nSize);
  }
  return iVar6;
}

Assistant:

int Wlc_NtkCreateLevelsRev( Wlc_Ntk_t * p )
{
    Wlc_Obj_t * pObj; 
    int i, k, iFanin, Level, LevelMax = 0;
    Vec_IntFill( &p->vLevels, Wlc_NtkObjNumMax(p), 0 );
    Wlc_NtkForEachObjReverse( p, pObj, i )
    {
        if ( Wlc_ObjIsCi(pObj) )
            continue;
        Level = Wlc_ObjLevel(p, pObj) + 1;
        Wlc_ObjForEachFanin( pObj, iFanin, k )
            Vec_IntUpdateEntry( &p->vLevels, iFanin, Level );
        LevelMax = Abc_MaxInt( LevelMax, Level );
    }
    // reverse the values
    Wlc_NtkForEachObj( p, pObj, i )
        Vec_IntWriteEntry( &p->vLevels, i, LevelMax - Wlc_ObjLevelId(p, i) );
    Wlc_NtkForEachCi( p, pObj, i )
        Vec_IntWriteEntry( &p->vLevels, Wlc_ObjId(p, pObj), 0 );
    //Wlc_NtkForEachObj( p, pObj, i )
    //    printf( "%d -> %d\n", i, Wlc_ObjLevelId(p, i) );
    return LevelMax;
}